

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O2

void __thiscall ON_SubDComponentRef::Clear(ON_SubDComponentRef *this)

{
  ON_Object::DestroyRuntimeCache((ON_Object *)this,true);
  ON_Object::PurgeUserData((ON_Object *)this);
  std::__shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2> *)&this->m_subd_ref);
  (this->m_component_ptr).m_ptr = 0;
  this->m_component_index = ON_COMPONENT_INDEX::UnsetComponentIndex;
  this->m_reference_id = 0;
  return;
}

Assistant:

void ON_SubDComponentRef::Clear()
{
  ON_Geometry::DestroyRuntimeCache();
  PurgeUserData();
  m_subd_ref.Clear();
  m_component_ptr = ON_SubDComponentPtr::Null;
  m_component_index = ON_COMPONENT_INDEX::UnsetComponentIndex;
  m_reference_id = 0;
}